

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_function_expression.cpp
# Opt level: O1

BindResult * __thiscall
duckdb::ExpressionBinder::BindExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,FunctionExpression *function,
          idx_t depth,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr)

{
  string *catalog;
  string *schema;
  QueryErrorContext error_context_p;
  pointer pcVar1;
  _Head_base<0UL,_duckdb::ColumnRefExpression_*,_false> _Var2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  optional_ptr<duckdb::CatalogEntry,_true> oVar6;
  _Head_base<0UL,_duckdb::ColumnRefExpression_*,_false> this_00;
  type pCVar7;
  pointer pOVar8;
  InvalidInputException *this_01;
  BinderException *this_02;
  CatalogType type;
  _Head_base<0UL,_duckdb::ColumnRefExpression_*,_false> _Var9;
  BindResult *pBVar10;
  unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
  colref;
  optional_ptr<duckdb::CatalogEntry,_true> func;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  new_colref;
  ErrorData error;
  EntryLookupInfo function_lookup;
  EntryLookupInfo table_function_lookup;
  _Head_base<0UL,_duckdb::ColumnRefExpression_*,_false> local_1b0;
  ExpressionBinder *local_1a8;
  optional_ptr<duckdb::CatalogEntry,_true> local_1a0;
  idx_t local_198;
  BindResult *local_190;
  undefined1 local_188 [32];
  _Alloc_hider local_168;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_160;
  optional_idx local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  char local_100 [8];
  char local_f8 [16];
  char *local_e8;
  char local_d8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_c8 [56];
  string local_90;
  EntryLookupInfo local_70;
  EntryLookupInfo local_50;
  
  error_context_p.query_location.index =
       (optional_idx)(function->super_ParsedExpression).super_BaseExpression.query_location.index;
  catalog = &function->catalog;
  schema = &function->schema;
  local_198 = depth;
  local_190 = __return_storage_ptr__;
  local_160 = expr_ptr;
  Binder::BindSchemaOrCatalog(this->binder,catalog,schema);
  local_158.index = (idx_t)error_context_p.query_location.index;
  EntryLookupInfo::EntryLookupInfo
            (&local_70,SCALAR_FUNCTION_ENTRY,&function->function_name,error_context_p);
  local_1a8 = this;
  local_1a0 = Binder::GetCatalogEntry(this->binder,catalog,schema,&local_70,RETURN_NULL);
  if (local_1a0.ptr == (CatalogEntry *)0x0) {
    EntryLookupInfo::EntryLookupInfo
              (&local_50,TABLE_FUNCTION_ENTRY,&function->function_name,
               (QueryErrorContext)local_158.index);
    oVar6 = Binder::GetCatalogEntry(local_1a8->binder,catalog,schema,&local_50,RETURN_NULL);
    if (oVar6.ptr != (CatalogEntry *)0x0) {
      this_02 = (BinderException *)__cxa_allocate_exception(0x10);
      local_110._M_allocated_capacity = (size_type)local_100;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,
                 "Function \"%s\" is a table function but it was used as a scalar function. This function has to be called in a FROM clause (similar to a table)."
                 ,"");
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      pcVar1 = (function->function_name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar1,pcVar1 + (function->function_name)._M_string_length);
      BinderException::BinderException<std::__cxx11::string>
                (this_02,&function->super_ParsedExpression,(string *)&local_110,&local_130);
      __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((function->schema)._M_string_length != 0) {
      ErrorData::ErrorData((ErrorData *)&local_110);
      local_1b0._M_head_impl = (ColumnRefExpression *)0x0;
      if ((function->catalog)._M_string_length == 0) {
        this_00._M_head_impl = (ColumnRefExpression *)operator_new(0x50);
        pcVar1 = (function->schema)._M_dataplus._M_p;
        local_188._0_8_ = (ColumnRefExpression *)(local_188 + 0x10);
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_188,pcVar1,pcVar1 + (function->schema)._M_string_length);
        ColumnRefExpression::ColumnRefExpression(this_00._M_head_impl,(string *)local_188);
        _Var9._M_head_impl = local_1b0._M_head_impl;
        if ((ColumnRefExpression *)local_188._0_8_ != (ColumnRefExpression *)(local_188 + 0x10)) {
          operator_delete((void *)local_188._0_8_);
          _Var9._M_head_impl = local_1b0._M_head_impl;
        }
      }
      else {
        make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string&,std::__cxx11::string&>
                  ((duckdb *)local_188,schema,catalog);
        uVar3 = local_188._0_8_;
        _Var2._M_head_impl = local_1b0._M_head_impl;
        local_188._0_8_ = (ColumnRefExpression *)0x0;
        local_1b0._M_head_impl = (ColumnRefExpression *)uVar3;
        _Var9._M_head_impl = (ColumnRefExpression *)local_188._0_8_;
        this_00._M_head_impl = local_1b0._M_head_impl;
        if (_Var2._M_head_impl != (ColumnRefExpression *)0x0) {
          (*((_Var2._M_head_impl)->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression
            [1])();
          _Var9._M_head_impl = (ColumnRefExpression *)local_188._0_8_;
          this_00._M_head_impl = local_1b0._M_head_impl;
        }
      }
      local_1b0._M_head_impl = this_00._M_head_impl;
      if (_Var9._M_head_impl != (ColumnRefExpression *)0x0) {
        (*((_Var9._M_head_impl)->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression
          [1])();
      }
      pCVar7 = unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
               ::operator*((unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                            *)&local_1b0);
      (*local_1a8->_vptr_ExpressionBinder[2])(local_188,local_1a8,pCVar7,&local_110);
      pCVar7 = unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
               ::operator*((unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                            *)&local_1b0);
      iVar5 = (*local_1a8->_vptr_ExpressionBinder[4])(local_1a8,pCVar7);
      _Var9._M_head_impl = local_1b0._M_head_impl;
      if ((byte)((byte)iVar5 | local_110._M_local_buf[0] ^ 1U) == 1) {
        local_1b0._M_head_impl = (ColumnRefExpression *)0x0;
        local_168._M_p = (pointer)_Var9._M_head_impl;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::_M_insert_rval(&(function->children).
                          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ,(function->children).
                          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,(value_type *)&local_168);
        if ((ColumnRefExpression *)local_168._M_p != (ColumnRefExpression *)0x0) {
          (**(code **)(*(long *)local_168._M_p + 8))();
        }
        ::std::__cxx11::string::_M_replace
                  ((ulong)catalog,0,(char *)(function->catalog)._M_string_length,0x1f09e61);
        ::std::__cxx11::string::_M_replace
                  ((ulong)schema,0,(char *)(function->schema)._M_string_length,0x1f09e61);
      }
      if ((ColumnRefExpression *)local_188._0_8_ != (ColumnRefExpression *)0x0) {
        (**(code **)(*(long *)local_188._0_8_ + 8))();
      }
      if (local_1b0._M_head_impl != (ColumnRefExpression *)0x0) {
        (*((local_1b0._M_head_impl)->super_ParsedExpression).super_BaseExpression.
          _vptr_BaseExpression[1])();
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_c8);
      if (local_e8 != local_d8) {
        operator_delete(local_e8);
      }
      if ((char *)local_110._8_8_ != local_f8) {
        operator_delete((void *)local_110._8_8_);
      }
    }
    local_1a0 = Binder::GetCatalogEntry(local_1a8->binder,catalog,schema,&local_70,THROW_EXCEPTION);
  }
  optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_1a0);
  if (((local_1a0.ptr)->type != AGGREGATE_FUNCTION_ENTRY) &&
     (((function->distinct != false ||
       ((function->filter).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0)) ||
      (pOVar8 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                ::operator->(&function->order_bys),
      (pOVar8->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pOVar8->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_finish)))) {
    this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_110._M_allocated_capacity = (size_type)local_100;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,
               "Function \"%s\" is a %s. \"DISTINCT\", \"FILTER\", and \"ORDER BY\" are only applicable to aggregate functions."
               ,"");
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    pcVar1 = (function->function_name)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar1,pcVar1 + (function->function_name)._M_string_length);
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_1a0);
    CatalogTypeToString_abi_cxx11_(&local_90,(duckdb *)(ulong)(local_1a0.ptr)->type,type);
    InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
              (this_01,(string *)&local_110,&local_150,&local_90);
    __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_1a0);
  if ((local_1a0.ptr)->type == MACRO_ENTRY) {
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_1a0);
    pBVar10 = local_190;
    (*local_1a8->_vptr_ExpressionBinder[0xc])
              (local_190,local_1a8,function,local_1a0.ptr,local_198,local_160);
  }
  else if ((local_1a0.ptr)->type == SCALAR_FUNCTION_ENTRY) {
    bVar4 = FunctionExpression::IsLambdaFunction(function);
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_1a0);
    pBVar10 = local_190;
    if (bVar4) {
      TryBindLambdaOrJson(local_190,local_1a8,function,local_198,local_1a0.ptr);
    }
    else {
      (*local_1a8->_vptr_ExpressionBinder[8])(local_190,local_1a8,function,local_1a0.ptr,local_198);
    }
  }
  else {
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_1a0);
    pBVar10 = local_190;
    (*local_1a8->_vptr_ExpressionBinder[10])(local_190,local_1a8,function,local_1a0.ptr,local_198);
  }
  return pBVar10;
}

Assistant:

BindResult ExpressionBinder::BindExpression(FunctionExpression &function, idx_t depth,
                                            unique_ptr<ParsedExpression> &expr_ptr) {
	// lookup the function in the catalog
	QueryErrorContext error_context(function.GetQueryLocation());
	binder.BindSchemaOrCatalog(function.catalog, function.schema);

	EntryLookupInfo function_lookup(CatalogType::SCALAR_FUNCTION_ENTRY, function.function_name, error_context);
	auto func = GetCatalogEntry(function.catalog, function.schema, function_lookup, OnEntryNotFound::RETURN_NULL);
	if (!func) {
		// function was not found - check if we this is a table function
		EntryLookupInfo table_function_lookup(CatalogType::TABLE_FUNCTION_ENTRY, function.function_name, error_context);
		auto table_func =
		    GetCatalogEntry(function.catalog, function.schema, table_function_lookup, OnEntryNotFound::RETURN_NULL);
		if (table_func) {
			throw BinderException(function,
			                      "Function \"%s\" is a table function but it was used as a scalar function. This "
			                      "function has to be called in a FROM clause (similar to a table).",
			                      function.function_name);
		}
		// not a table function - check if the schema is set
		if (!function.schema.empty()) {
			// the schema is set - check if we can turn this the schema into a column ref
			ErrorData error;
			unique_ptr<ColumnRefExpression> colref;
			if (function.catalog.empty()) {
				colref = make_uniq<ColumnRefExpression>(function.schema);
			} else {
				colref = make_uniq<ColumnRefExpression>(function.schema, function.catalog);
			}
			auto new_colref = QualifyColumnName(*colref, error);
			bool is_col = !error.HasError();
			bool is_col_alias = QualifyColumnAlias(*colref);

			if (is_col || is_col_alias) {
				// we can! transform this into a function call on the column
				// i.e. "x.lower()" becomes "lower(x)"
				function.children.insert(function.children.begin(), std::move(colref));
				function.catalog = INVALID_CATALOG;
				function.schema = INVALID_SCHEMA;
			}
		}
		// rebind the function
		func = GetCatalogEntry(function.catalog, function.schema, function_lookup, OnEntryNotFound::THROW_EXCEPTION);
	}

	if (func->type != CatalogType::AGGREGATE_FUNCTION_ENTRY &&
	    (function.distinct || function.filter || !function.order_bys->orders.empty())) {
		throw InvalidInputException("Function \"%s\" is a %s. \"DISTINCT\", \"FILTER\", and \"ORDER BY\" are only "
		                            "applicable to aggregate functions.",
		                            function.function_name, CatalogTypeToString(func->type));
	}

	switch (func->type) {
	case CatalogType::SCALAR_FUNCTION_ENTRY: {
		if (function.IsLambdaFunction()) {
			return TryBindLambdaOrJson(function, depth, *func);
		}
		return BindFunction(function, func->Cast<ScalarFunctionCatalogEntry>(), depth);
	}
	case CatalogType::MACRO_ENTRY:
		// macro function
		return BindMacro(function, func->Cast<ScalarMacroCatalogEntry>(), depth, expr_ptr);
	default:
		// aggregate function
		return BindAggregate(function, func->Cast<AggregateFunctionCatalogEntry>(), depth);
	}
}